

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int subpel_select(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *mv,MV ref_mv,
                 FULLPEL_MV start_mv,_Bool fullpel_performed_well)

{
  int iVar1;
  int iVar2;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int qband;
  int th_idx;
  int th_vals [2] [3];
  int local_48;
  int mv_thresh_1;
  int is_low_resoln;
  int mv_thresh;
  int reduce_mv_pel_precision_highmotion;
  int frame_lowmotion;
  _Bool fullpel_performed_well_local;
  int_mv *mv_local;
  BLOCK_SIZE bsize_local;
  MACROBLOCK *x_local;
  AV1_COMP *cpi_local;
  short local_8;
  short sStack_6;
  FULLPEL_MV start_mv_local;
  
  iVar1 = (cpi->rc).avg_frame_low_motion;
  iVar2 = (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion;
  if (iVar2 < 3) {
    if (0 < iVar2) {
      _qband = 0x800000004;
      th_vals[0][0] = 10;
      th_vals[0][1] = 4;
      th_vals[0][2] = 6;
      th_vals[1][0] = 8;
      iVar2 = iVar2 + -1;
      if ((iVar1 < 1) || (0x27 < iVar1)) {
        if (bsize < BLOCK_32X32) {
          if (bsize < BLOCK_16X16) {
            local_80 = th_vals[iVar2][0];
          }
          else {
            local_80 = th_vals[(long)iVar2 + -1][2];
          }
          local_7c = local_80;
        }
        else {
          local_7c = (&qband)[(long)iVar2 * 3];
        }
        local_48 = local_7c;
      }
      else {
        local_48 = 0xc;
      }
      iVar1 = (int)(mv->as_mv).row;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (SBORROW4(iVar1,local_48 * 2) != iVar1 + local_48 * -2 < 0) {
        iVar1 = (int)(mv->as_mv).col;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (SBORROW4(iVar1,local_48 * 2) != iVar1 + local_48 * -2 < 0) {
          iVar1 = (int)(mv->as_mv).row;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          if (iVar1 < local_48) {
            iVar1 = (int)(mv->as_mv).col;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            if (iVar1 < local_48) goto LAB_002efb2b;
          }
          return 2;
        }
      }
      return 3;
    }
LAB_002efb2b:
    if ((cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex < 2) {
      if (((((0 < (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex) && (fullpel_performed_well))
           && (local_8 = ref_mv.row, local_8 == 0)) &&
          ((sStack_6 = ref_mv.col, sStack_6 == 0 &&
           (cpi_local._4_2_ = start_mv.row, cpi_local._4_2_ == 0)))) &&
         (cpi_local._6_2_ = start_mv.col, cpi_local._6_2_ == 0)) {
        return 2;
      }
    }
    else if ((((x->content_state_sb).source_sad_nonrd < kLowSad) && (BLOCK_16X16 < bsize)) &&
            (x->qindex >> 6 != 0)) {
      if (x->source_variance < 500) {
        return 3;
      }
      if (x->source_variance < 5000) {
        return 2;
      }
    }
    start_mv_local._1_3_ = 0;
    start_mv_local.row._0_1_ = (cpi->sf).mv_sf.subpel_force_stop;
    start_mv_local.col = (int16_t)(0 >> 8);
    iVar1._0_2_ = start_mv_local.row;
    iVar1._2_2_ = start_mv_local.col;
    return iVar1;
  }
  if (bsize < BLOCK_32X64) {
    local_74 = 6;
    if (BLOCK_16X16 < bsize) {
      local_74 = 4;
    }
  }
  else {
    local_74 = 2;
  }
  mv_thresh_1 = local_74;
  if ((0 < iVar1) && (iVar1 < 0x28)) {
    mv_thresh_1 = 0xc;
  }
  if ((cpi->common).width * (cpi->common).height < 0x12c01) {
    local_78 = mv_thresh_1 >> 1;
  }
  else {
    local_78 = mv_thresh_1;
  }
  iVar1 = (int)(mv->as_mv).row;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 < local_78) {
    iVar1 = (int)(mv->as_mv).col;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar1 < local_78) goto LAB_002efb2b;
  }
  return 2;
}

Assistant:

static inline int subpel_select(AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                                int_mv *mv, MV ref_mv, FULLPEL_MV start_mv,
                                bool fullpel_performed_well) {
  const int frame_lowmotion = cpi->rc.avg_frame_low_motion;
  const int reduce_mv_pel_precision_highmotion =
      cpi->sf.rt_sf.reduce_mv_pel_precision_highmotion;

  // Reduce MV precision for higher int MV value & frame-level motion
  if (reduce_mv_pel_precision_highmotion >= 3) {
    int mv_thresh = 4;
    const int is_low_resoln =
        (cpi->common.width * cpi->common.height <= 320 * 240);
    mv_thresh = (bsize > BLOCK_32X32) ? 2 : (bsize > BLOCK_16X16) ? 4 : 6;
    if (frame_lowmotion > 0 && frame_lowmotion < 40) mv_thresh = 12;
    mv_thresh = (is_low_resoln) ? mv_thresh >> 1 : mv_thresh;
    if (abs(mv->as_fullmv.row) >= mv_thresh ||
        abs(mv->as_fullmv.col) >= mv_thresh)
      return HALF_PEL;
  } else if (reduce_mv_pel_precision_highmotion >= 1) {
    int mv_thresh;
    const int th_vals[2][3] = { { 4, 8, 10 }, { 4, 6, 8 } };
    const int th_idx = reduce_mv_pel_precision_highmotion - 1;
    assert(th_idx >= 0 && th_idx < 2);
    if (frame_lowmotion > 0 && frame_lowmotion < 40)
      mv_thresh = 12;
    else
      mv_thresh = (bsize >= BLOCK_32X32)   ? th_vals[th_idx][0]
                  : (bsize >= BLOCK_16X16) ? th_vals[th_idx][1]
                                           : th_vals[th_idx][2];
    if (abs(mv->as_fullmv.row) >= (mv_thresh << 1) ||
        abs(mv->as_fullmv.col) >= (mv_thresh << 1))
      return FULL_PEL;
    else if (abs(mv->as_fullmv.row) >= mv_thresh ||
             abs(mv->as_fullmv.col) >= mv_thresh)
      return HALF_PEL;
  }
  // Reduce MV precision for relatively static (e.g. background), low-complex
  // large areas
  if (cpi->sf.rt_sf.reduce_mv_pel_precision_lowcomplex >= 2) {
    const int qband = x->qindex >> (QINDEX_BITS - 2);
    assert(qband < 4);
    if (x->content_state_sb.source_sad_nonrd <= kVeryLowSad &&
        bsize > BLOCK_16X16 && qband != 0) {
      if (x->source_variance < 500)
        return FULL_PEL;
      else if (x->source_variance < 5000)
        return HALF_PEL;
    }
  } else if (cpi->sf.rt_sf.reduce_mv_pel_precision_lowcomplex >= 1) {
    if (fullpel_performed_well && ref_mv.row == 0 && ref_mv.col == 0 &&
        start_mv.row == 0 && start_mv.col == 0)
      return HALF_PEL;
  }
  return cpi->sf.mv_sf.subpel_force_stop;
}